

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  size_type *psVar1;
  char cVar2;
  undefined8 this;
  bool bVar3;
  SpecialProperties SVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 local_1d8 [8];
  TestCaseInfo info;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  undefined1 local_58 [8];
  string tag;
  
  psVar1 = &info.name._M_string_length;
  local_1d8 = (undefined1  [8])psVar1;
  tag.field_2._8_8_ = _lineInfo;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"./","");
  bVar3 = startsWith(_name,(string *)local_1d8);
  if (local_1d8 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_1d8);
  }
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tags;
  tags._M_t._M_impl._0_4_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&desc._M_string_length;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length._0_1_ = 0;
  local_58 = (undefined1  [8])&tag._M_string_length;
  tag._M_dataplus._M_p = (pointer)0x0;
  tag._M_string_length._0_1_ = 0;
  tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  desc.field_2._8_8_ = __return_storage_ptr__;
  if (_descOrTags->_M_string_length != 0) {
    bVar7 = false;
    uVar6 = 0;
    do {
      cVar2 = (_descOrTags->_M_dataplus)._M_p[uVar6];
      if (bVar7) {
        if (cVar2 == ']') {
          SVar4 = parseSpecialTag((string *)local_58);
          if (SVar4 == None) {
            enforceNotReservedTag((string *)local_58,(SourceLineInfo *)tag.field_2._8_8_);
            bVar5 = bVar3;
          }
          else {
            bVar5 = true;
            if (SVar4 != IsHidden) {
              bVar5 = bVar3;
            }
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&info.properties,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
          tag._M_dataplus._M_p = (pointer)0x0;
          *(char *)local_58 = '\0';
          bVar7 = false;
          bVar3 = bVar5;
        }
        else {
          bVar7 = true;
          std::__cxx11::string::push_back((char)local_58);
        }
      }
      else {
        bVar7 = true;
        if (cVar2 != '[') {
          std::__cxx11::string::push_back((char)&tags + '(');
          bVar7 = false;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < _descOrTags->_M_string_length);
  }
  this = desc.field_2._8_8_;
  psVar1 = &info.name._M_string_length;
  if (bVar3 != false) {
    local_1d8 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"hide","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&info.properties,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    if (local_1d8 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_1d8);
    }
    local_1d8 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,".","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&info.properties,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    if (local_1d8 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_1d8);
    }
  }
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_1d8,_name,_className,
             (string *)&tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&info.properties,(SourceLineInfo *)tag.field_2._8_8_);
  TestCase::TestCase((TestCase *)this,_testCase,(TestCaseInfo *)local_1d8);
  if ((size_type *)info.tagsAsString.field_2._8_8_ != &info.lineInfo.file._M_string_length) {
    operator_delete((void *)info.tagsAsString.field_2._8_8_);
  }
  if ((size_type *)info.lcaseTags._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      &info.tagsAsString._M_string_length) {
    operator_delete((void *)info.lcaseTags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&info.tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&info.description.field_2 + 8));
  if ((size_type *)info.className.field_2._8_8_ != &info.description._M_string_length) {
    operator_delete((void *)info.className.field_2._8_8_);
  }
  if ((size_type *)info.name.field_2._8_8_ != &info.className._M_string_length) {
    operator_delete((void *)info.name.field_2._8_8_);
  }
  if (local_1d8 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_1d8);
  }
  if (local_58 != (undefined1  [8])&tag._M_string_length) {
    operator_delete((void *)local_58);
  }
  if ((size_type *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count != &desc._M_string_length)
  {
    operator_delete((void *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&info.properties);
  return (TestCase *)this;
}

Assistant:

TestCase makeTestCase(ITestCase* _testCase,
		std::string const& _className,
		std::string const& _name,
		std::string const& _descOrTags,
		SourceLineInfo const& _lineInfo)
	{
		bool isHidden(startsWith(_name, "./")); // Legacy support

												// Parse out tags
		std::set<std::string> tags;
		std::string desc, tag;
		bool inTag = false;
		for (std::size_t i = 0; i < _descOrTags.size(); ++i) {
			char c = _descOrTags[i];
			if (!inTag) {
				if (c == '[')
					inTag = true;
				else
					desc += c;
			}
			else {
				if (c == ']') {
					TestCaseInfo::SpecialProperties prop = parseSpecialTag(tag);
					if (prop == TestCaseInfo::IsHidden)
						isHidden = true;
					else if (prop == TestCaseInfo::None)
						enforceNotReservedTag(tag, _lineInfo);

					tags.insert(tag);
					tag.clear();
					inTag = false;
				}
				else
					tag += c;
			}
		}
		if (isHidden) {
			tags.insert("hide");
			tags.insert(".");
		}

		TestCaseInfo info(_name, _className, desc, tags, _lineInfo);
		return TestCase(_testCase, info);
	}